

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_by_code.c
# Opt level: O2

int archive_read_support_format_by_code(archive *a,int format_code)

{
  int iVar1;
  wchar_t wVar2;
  
  iVar1 = __archive_check_magic(a,0xdeb0c5,1,"archive_read_support_format_by_code");
  if (iVar1 != -0x1e) {
    switch((format_code & 0xff0000U) - 0x10000 >> 0x10) {
    case 0:
      iVar1 = archive_read_support_format_cpio(a);
      return iVar1;
    case 2:
      wVar2 = archive_read_support_format_tar(a);
      return wVar2;
    case 3:
      iVar1 = archive_read_support_format_iso9660(a);
      return iVar1;
    case 4:
      wVar2 = archive_read_support_format_zip(a);
      return wVar2;
    case 6:
      iVar1 = archive_read_support_format_ar(a);
      return iVar1;
    case 7:
      iVar1 = archive_read_support_format_mtree(a);
      return iVar1;
    case 9:
      iVar1 = archive_read_support_format_xar(a);
      return iVar1;
    case 10:
      wVar2 = archive_read_support_format_lha(a);
      return wVar2;
    case 0xb:
      wVar2 = archive_read_support_format_cab(a);
      return wVar2;
    case 0xc:
      iVar1 = archive_read_support_format_rar(a);
      return iVar1;
    case 0xd:
      iVar1 = archive_read_support_format_7zip(a);
      return iVar1;
    }
  }
  return -0x1e;
}

Assistant:

int
archive_read_support_format_by_code(struct archive *a, int format_code)
{
	archive_check_magic(a, ARCHIVE_READ_MAGIC,
	    ARCHIVE_STATE_NEW, "archive_read_support_format_by_code");

	switch (format_code & ARCHIVE_FORMAT_BASE_MASK) {
	case ARCHIVE_FORMAT_7ZIP:
		return archive_read_support_format_7zip(a);
		break;
	case ARCHIVE_FORMAT_AR:
		return archive_read_support_format_ar(a);
		break;
	case ARCHIVE_FORMAT_CAB:
		return archive_read_support_format_cab(a);
		break;
	case ARCHIVE_FORMAT_CPIO:
		return archive_read_support_format_cpio(a);
		break;
	case ARCHIVE_FORMAT_ISO9660:
		return archive_read_support_format_iso9660(a);
		break;
	case ARCHIVE_FORMAT_LHA:
		return archive_read_support_format_lha(a);
		break;
	case ARCHIVE_FORMAT_MTREE:
		return archive_read_support_format_mtree(a);
		break;
	case ARCHIVE_FORMAT_RAR:
		return archive_read_support_format_rar(a);
		break;
	case ARCHIVE_FORMAT_TAR:
		return archive_read_support_format_tar(a);
		break;
	case ARCHIVE_FORMAT_XAR:
		return archive_read_support_format_xar(a);
		break;
	case ARCHIVE_FORMAT_ZIP:
		return archive_read_support_format_zip(a);
		break;
	}
	return (ARCHIVE_FATAL);
}